

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_application_info
          (Impl *this,StateCreatorInterface *iface,Value *app_info,Value *pdf_info)

{
  bool bVar1;
  uint uVar2;
  Type pGVar3;
  char *__dest;
  VkPhysicalDeviceFeatures2 *__dest_00;
  Ch *pCVar4;
  StateRecorderApplicationFeatureHash local_90;
  Hash local_80;
  Hash hash_1;
  Hash local_68;
  Hash hash;
  VkPhysicalDeviceFeatures2 *pdf;
  char *name_1;
  char *pcStack_48;
  SizeType len_1;
  char *name;
  VkApplicationInfo *pVStack_38;
  SizeType len;
  VkApplicationInfo *app;
  Value *pdf_info_local;
  Value *app_info_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  app = (VkApplicationInfo *)pdf_info;
  pdf_info_local = app_info;
  app_info_local = (Value *)iface;
  iface_local = (StateCreatorInterface *)this;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(app_info,"apiVersion");
  if ((bVar1) &&
     (bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)app,"robustBufferAccess"), bVar1)) {
    pVStack_38 = ScratchAllocator::allocate_cleared<VkApplicationInfo>(&this->allocator);
    pVStack_38->sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)pdf_info_local,"apiVersion");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar3);
    pVStack_38->apiVersion = uVar2;
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)pdf_info_local,"applicationVersion");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar3);
    pVStack_38->applicationVersion = uVar2;
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)pdf_info_local,"engineVersion");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar3);
    pVStack_38->engineVersion = uVar2;
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(pdf_info_local,"applicationName");
    if (bVar1) {
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)pdf_info_local,"applicationName");
      name._4_4_ = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetStringLength(pGVar3);
      __dest = ScratchAllocator::allocate_n_cleared<char>(&this->allocator,(ulong)(name._4_4_ + 1));
      pcStack_48 = __dest;
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)pdf_info_local,"applicationName");
      pCVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar3);
      memcpy(__dest,pCVar4,(ulong)name._4_4_);
      pVStack_38->pApplicationName = pcStack_48;
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(pdf_info_local,"engineName");
    if (bVar1) {
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)pdf_info_local,"engineName");
      name_1._4_4_ = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetStringLength(pGVar3);
      __dest_00 = (VkPhysicalDeviceFeatures2 *)
                  ScratchAllocator::allocate_n_cleared<char>
                            (&this->allocator,(ulong)(name_1._4_4_ + 1));
      pdf = __dest_00;
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)pdf_info_local,"engineName");
      pCVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar3);
      memcpy(__dest_00,pCVar4,(ulong)name_1._4_4_);
      pVStack_38->pEngineName = (char *)pdf;
    }
    hash = (Hash)ScratchAllocator::allocate_cleared<VkPhysicalDeviceFeatures2>(&this->allocator);
    ((VkPhysicalDeviceFeatures2 *)hash)->sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    pGVar3 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)app,"robustBufferAccess");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar3);
    *(uint *)(hash + 0x10) = uVar2;
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)app,"pNext");
    if (bVar1) {
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)app,"pNext");
      bVar1 = parse_pnext_chain_pdf2(this,pGVar3,(void **)(hash + 8));
      if (!bVar1) {
        return false;
      }
    }
    _hash_1 = Hashing::compute_application_feature_hash(pVStack_38,(void *)hash);
    local_68 = Hashing::compute_combined_application_feature_hash
                         ((StateRecorderApplicationFeatureHash *)&hash_1);
    (**(code **)((app_info_local->data_).n.i64 + 0x10))(app_info_local,local_68,pVStack_38,hash);
  }
  else {
    local_90 = Hashing::compute_application_feature_hash((VkApplicationInfo *)0x0,(void *)0x0);
    local_80 = Hashing::compute_combined_application_feature_hash(&local_90);
    (**(code **)((app_info_local->data_).n.i64 + 0x10))(app_info_local,local_80,0);
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_application_info(StateCreatorInterface &iface, const Value &app_info, const Value &pdf_info)
{
	if (app_info.HasMember("apiVersion") && pdf_info.HasMember("robustBufferAccess"))
	{
		auto *app = allocator.allocate_cleared<VkApplicationInfo>();
		app->sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
		app->apiVersion = app_info["apiVersion"].GetUint();
		app->applicationVersion = app_info["applicationVersion"].GetUint();
		app->engineVersion = app_info["engineVersion"].GetUint();

		if (app_info.HasMember("applicationName"))
		{
			auto len = app_info["applicationName"].GetStringLength();
			char *name = allocator.allocate_n_cleared<char>(len + 1);
			memcpy(name, app_info["applicationName"].GetString(), len);
			app->pApplicationName = name;
		}

		if (app_info.HasMember("engineName"))
		{
			auto len = app_info["engineName"].GetStringLength();
			char *name = allocator.allocate_n_cleared<char>(len + 1);
			memcpy(name, app_info["engineName"].GetString(), len);
			app->pEngineName = name;
		}

		auto *pdf = allocator.allocate_cleared<VkPhysicalDeviceFeatures2>();
		pdf->sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
		pdf->features.robustBufferAccess = pdf_info["robustBufferAccess"].GetUint();

		if (pdf_info.HasMember("pNext"))
			if (!parse_pnext_chain_pdf2(pdf_info["pNext"], &pdf->pNext))
				return false;

		auto hash =
				Hashing::compute_combined_application_feature_hash(
						Hashing::compute_application_feature_hash(app, pdf));
		iface.set_application_info(hash, app, pdf);
	}
	else
	{
		auto hash =
				Hashing::compute_combined_application_feature_hash(
						Hashing::compute_application_feature_hash(nullptr, nullptr));
		iface.set_application_info(hash, nullptr, nullptr);
	}

	return true;
}